

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O3

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::CopyString
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char **a_pString)

{
  size_t *psVar1;
  char *__s;
  size_t sVar2;
  _List_node_base *__dest;
  _List_node_base *p_Var3;
  
  __s = *a_pString;
  sVar2 = strlen(__s);
  __dest = (_List_node_base *)operator_new__(sVar2 + 1);
  memcpy(__dest,__s,sVar2 + 1);
  p_Var3 = (_List_node_base *)operator_new(0x28);
  p_Var3[1]._M_next = __dest;
  p_Var3[1]._M_prev = (_List_node_base *)0x0;
  *(undefined4 *)&p_Var3[2]._M_next = 0;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->m_strings).
            super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  *a_pString = (char *)__dest;
  return SI_OK;
}

Assistant:

SI_Error
CSimpleIniTempl<SI_CHAR,SI_STRLESS,SI_CONVERTER>::CopyString(
    const SI_CHAR *& a_pString
    )
{
    size_t uLen = 0;
    if (sizeof(SI_CHAR) == sizeof(char)) {
        uLen = strlen((const char *)a_pString);
    }
    else if (sizeof(SI_CHAR) == sizeof(wchar_t)) {
        uLen = wcslen((const wchar_t *)a_pString);
    }
    else {
        for ( ; a_pString[uLen]; ++uLen) /*loop*/ ;
    }
    ++uLen; // NULL character
    SI_CHAR * pCopy = new SI_CHAR[uLen];
    if (!pCopy) {
        return SI_NOMEM;
    }
    memcpy(pCopy, a_pString, sizeof(SI_CHAR)*uLen);
    m_strings.push_back(pCopy);
    a_pString = pCopy;
    return SI_OK;
}